

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string2.cpp
# Opt level: O0

void __thiscall String::String(String *this,String *rhs)

{
  size_t sVar1;
  char *pcVar2;
  char *__src;
  ostream *this_00;
  String *rhs_local;
  String *this_local;
  
  sVar1 = size(rhs);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  this->data_ = pcVar2;
  pcVar2 = this->data_;
  __src = c_str(rhs);
  strcpy(pcVar2,__src);
  this_00 = std::operator<<((ostream *)&std::cout,"String::String(const String&)");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

String(const String& rhs)
    : data_(new char[rhs.size() + 1])
  {
    strcpy(data_, rhs.c_str());
    std::cout << "String::String(const String&)" << std::endl;
  }